

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

bool __thiscall mkvparser::Segment::AppendCluster(Segment *this,Cluster *pCluster)

{
  long lVar1;
  undefined1 auVar2 [16];
  long *plVar3;
  ulong uVar4;
  Cluster **ppCVar5;
  Cluster **ppCVar6;
  long lVar7;
  ulong local_88;
  Cluster **qq_1;
  Cluster **q_1;
  Cluster **p_1;
  Cluster **pp;
  Cluster **p;
  Cluster **q;
  Cluster **qq;
  long n;
  long idx;
  long *size;
  long count;
  Cluster *pCluster_local;
  Segment *this_local;
  
  if ((pCluster == (Cluster *)0x0) || (pCluster->m_index < 0)) {
    this_local._7_1_ = false;
  }
  else {
    lVar7 = this->m_clusterCount + this->m_clusterPreloadCount;
    plVar3 = &this->m_clusterSize;
    lVar1 = pCluster->m_index;
    if ((*plVar3 < lVar7) || (lVar1 != this->m_clusterCount)) {
      this_local._7_1_ = false;
    }
    else {
      if (*plVar3 <= lVar7) {
        if (*plVar3 < 1) {
          local_88 = 0x800;
        }
        else {
          local_88 = *plVar3 << 1;
        }
        auVar2._8_8_ = 0;
        auVar2._0_8_ = local_88;
        uVar4 = SUB168(auVar2 * ZEXT816(8),0);
        if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
          uVar4 = 0xffffffffffffffff;
        }
        ppCVar5 = (Cluster **)operator_new__(uVar4,(nothrow_t *)&std::nothrow);
        if (ppCVar5 == (Cluster **)0x0) {
          return false;
        }
        ppCVar6 = this->m_clusters;
        pp = ppCVar6;
        p = ppCVar5;
        while (pp != ppCVar6 + lVar7) {
          *p = *pp;
          pp = pp + 1;
          p = p + 1;
        }
        if (this->m_clusters != (Cluster **)0x0) {
          operator_delete__(this->m_clusters);
        }
        this->m_clusters = ppCVar5;
        *plVar3 = local_88;
      }
      if (0 < this->m_clusterPreloadCount) {
        ppCVar5 = this->m_clusters + this->m_clusterCount;
        if ((*ppCVar5 == (Cluster *)0x0) || (-1 < (*ppCVar5)->m_index)) {
          return false;
        }
        qq_1 = ppCVar5 + this->m_clusterPreloadCount;
        if (this->m_clusters + *plVar3 <= ppCVar5 + this->m_clusterPreloadCount) {
          return false;
        }
        do {
          ppCVar6 = qq_1 + -1;
          if (-1 < (*ppCVar6)->m_index) {
            return false;
          }
          *qq_1 = *ppCVar6;
          qq_1 = ppCVar6;
        } while (ppCVar6 != ppCVar5);
      }
      this->m_clusters[lVar1] = pCluster;
      this->m_clusterCount = this->m_clusterCount + 1;
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Segment::AppendCluster(Cluster* pCluster) {
  if (pCluster == NULL || pCluster->m_index < 0)
    return false;

  const long count = m_clusterCount + m_clusterPreloadCount;

  long& size = m_clusterSize;
  const long idx = pCluster->m_index;

  if (size < count || idx != m_clusterCount)
    return false;

  if (count >= size) {
    const long n = (size <= 0) ? 2048 : 2 * size;

    Cluster** const qq = new (std::nothrow) Cluster*[n];
    if (qq == NULL)
      return false;

    Cluster** q = qq;
    Cluster** p = m_clusters;
    Cluster** const pp = p + count;

    while (p != pp)
      *q++ = *p++;

    delete[] m_clusters;

    m_clusters = qq;
    size = n;
  }

  if (m_clusterPreloadCount > 0) {
    Cluster** const p = m_clusters + m_clusterCount;
    if (*p == NULL || (*p)->m_index >= 0)
      return false;

    Cluster** q = p + m_clusterPreloadCount;
    if (q >= (m_clusters + size))
      return false;

    for (;;) {
      Cluster** const qq = q - 1;
      if ((*qq)->m_index >= 0)
        return false;

      *q = *qq;
      q = qq;

      if (q == p)
        break;
    }
  }

  m_clusters[idx] = pCluster;
  ++m_clusterCount;
  return true;
}